

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall
ON_SubD::DeleteMarkedComponents
          (ON_SubD *this,bool bDeleteMarkedComponents,ON__UINT8 mark_bits,bool bMarkDeletedFaceEdges
          )

{
  bool bVar1;
  ON_SimpleArray<ON_SubDComponentPtr> cptr_list;
  
  cptr_list._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0082ba60;
  cptr_list.m_a = (ON_SubDComponentPtr *)0x0;
  cptr_list.m_count = 0;
  cptr_list.m_capacity = 0;
  GetMarkedComponents(this,bDeleteMarkedComponents,mark_bits,true,true,true,&cptr_list);
  bVar1 = DeleteComponents(this,cptr_list.m_a,cptr_list._16_8_ & 0xffffffff,bMarkDeletedFaceEdges);
  ON_SimpleArray<ON_SubDComponentPtr>::~ON_SimpleArray(&cptr_list);
  return bVar1;
}

Assistant:

bool ON_SubD::DeleteMarkedComponents(
  bool bDeleteMarkedComponents,
  ON__UINT8 mark_bits,
  bool bMarkDeletedFaceEdges
)
{
  ON_SimpleArray<ON_SubDComponentPtr> cptr_list;
  GetMarkedComponents(bDeleteMarkedComponents, mark_bits, true, true, true, cptr_list);
  return DeleteComponents(
    cptr_list.Array(),
    cptr_list.UnsignedCount(),
    bMarkDeletedFaceEdges
  );
}